

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct16_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  __m128i __rounding_00;
  __m128i __rounding_01;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined8 uVar139;
  undefined8 uVar140;
  int iVar141;
  uint uVar142;
  int iVar143;
  uint uVar144;
  int iVar145;
  uint uVar146;
  int iVar147;
  uint uVar148;
  int iVar149;
  uint uVar150;
  int iVar151;
  uint uVar152;
  undefined4 uVar153;
  int iVar154;
  int iVar155;
  uint uVar156;
  uint uVar157;
  int iVar158;
  int32_t *piVar159;
  undefined8 *in_RDI;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  __m128i d1_9;
  __m128i d0_9;
  __m128i c1_9;
  __m128i c0_9;
  __m128i b1_9;
  __m128i b0_9;
  __m128i a1_9;
  __m128i a0_9;
  __m128i v1_9;
  __m128i v0_9;
  __m128i u1_9;
  __m128i u0_9;
  __m128i t1_9;
  __m128i t0_9;
  __m128i d1_8;
  __m128i d0_8;
  __m128i c1_8;
  __m128i c0_8;
  __m128i b1_8;
  __m128i b0_8;
  __m128i a1_8;
  __m128i a0_8;
  __m128i v1_8;
  __m128i v0_8;
  __m128i u1_8;
  __m128i u0_8;
  __m128i t1_8;
  __m128i t0_8;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x [16];
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  __m128i cospi_p16_p48;
  __m128i cospi_p48_m16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_p40_p24;
  __m128i cospi_p24_m40;
  __m128i cospi_p08_p56;
  __m128i cospi_p56_m08;
  __m128i cospi_p52_p12;
  __m128i cospi_p12_m52;
  __m128i cospi_p20_p44;
  __m128i cospi_p44_m20;
  __m128i cospi_p36_p28;
  __m128i cospi_p28_m36;
  __m128i cospi_p04_p60;
  __m128i cospi_p60_m04;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  longlong local_1a78;
  int8_t iStack_1a61;
  longlong lStack_1a60;
  undefined2 local_1808;
  undefined2 uStack_1806;
  undefined2 uStack_1804;
  undefined2 uStack_1802;
  undefined2 local_17f8;
  undefined2 uStack_17f6;
  undefined2 uStack_17f4;
  undefined2 uStack_17f2;
  undefined2 local_17e8;
  undefined2 uStack_17e6;
  undefined2 uStack_17e4;
  undefined2 uStack_17e2;
  undefined2 local_17d8;
  undefined2 uStack_17d6;
  undefined2 uStack_17d4;
  undefined2 uStack_17d2;
  undefined2 local_17c8;
  undefined2 uStack_17c6;
  undefined2 uStack_17c4;
  undefined2 uStack_17c2;
  undefined2 local_17b8;
  undefined2 uStack_17b6;
  undefined2 uStack_17b4;
  undefined2 uStack_17b2;
  undefined2 local_17a8;
  undefined2 uStack_17a6;
  undefined2 uStack_17a4;
  undefined2 uStack_17a2;
  undefined2 local_1798;
  undefined2 uStack_1796;
  undefined2 uStack_1794;
  undefined2 uStack_1792;
  undefined2 local_1788;
  undefined2 uStack_1786;
  undefined2 uStack_1784;
  undefined2 uStack_1782;
  undefined2 local_1778;
  undefined2 uStack_1776;
  undefined2 uStack_1774;
  undefined2 uStack_1772;
  undefined2 local_1768;
  undefined2 uStack_1766;
  undefined2 uStack_1764;
  undefined2 uStack_1762;
  undefined2 local_1758;
  undefined2 uStack_1756;
  undefined2 uStack_1754;
  undefined2 uStack_1752;
  undefined2 local_1748;
  undefined2 uStack_1746;
  undefined2 uStack_1744;
  undefined2 uStack_1742;
  undefined2 local_1738;
  undefined2 uStack_1736;
  undefined2 uStack_1734;
  undefined2 uStack_1732;
  undefined2 local_1728;
  undefined2 uStack_1726;
  undefined2 uStack_1724;
  undefined2 uStack_1722;
  undefined2 local_1718;
  undefined2 uStack_1716;
  undefined2 uStack_1714;
  undefined2 uStack_1712;
  undefined2 local_1708;
  undefined2 uStack_1706;
  undefined2 uStack_1704;
  undefined2 uStack_1702;
  undefined2 local_16f8;
  undefined2 uStack_16f6;
  undefined2 uStack_16f4;
  undefined2 uStack_16f2;
  undefined2 local_16e8;
  undefined2 uStack_16e6;
  undefined2 uStack_16e4;
  undefined2 uStack_16e2;
  undefined2 local_16d8;
  undefined2 uStack_16d6;
  undefined2 uStack_16d4;
  undefined2 uStack_16d2;
  undefined2 uStack_16c0;
  undefined2 uStack_16be;
  undefined2 uStack_16bc;
  undefined2 uStack_16ba;
  undefined2 uStack_16b0;
  undefined2 uStack_16ae;
  undefined2 uStack_16ac;
  undefined2 uStack_16aa;
  undefined2 uStack_16a0;
  undefined2 uStack_169e;
  undefined2 uStack_169c;
  undefined2 uStack_169a;
  undefined2 uStack_1690;
  undefined2 uStack_168e;
  undefined2 uStack_168c;
  undefined2 uStack_168a;
  undefined2 uStack_1680;
  undefined2 uStack_167e;
  undefined2 uStack_167c;
  undefined2 uStack_167a;
  undefined2 uStack_1670;
  undefined2 uStack_166e;
  undefined2 uStack_166c;
  undefined2 uStack_166a;
  undefined2 uStack_1660;
  undefined2 uStack_165e;
  undefined2 uStack_165c;
  undefined2 uStack_165a;
  undefined2 uStack_1650;
  undefined2 uStack_164e;
  undefined2 uStack_164c;
  undefined2 uStack_164a;
  undefined2 uStack_1640;
  undefined2 uStack_163e;
  undefined2 uStack_163c;
  undefined2 uStack_163a;
  undefined2 uStack_1630;
  undefined2 uStack_162e;
  undefined2 uStack_162c;
  undefined2 uStack_162a;
  undefined2 uStack_1620;
  undefined2 uStack_161e;
  undefined2 uStack_161c;
  undefined2 uStack_161a;
  undefined2 uStack_1610;
  undefined2 uStack_160e;
  undefined2 uStack_160c;
  undefined2 uStack_160a;
  undefined2 uStack_1600;
  undefined2 uStack_15fe;
  undefined2 uStack_15fc;
  undefined2 uStack_15fa;
  undefined2 uStack_15f0;
  undefined2 uStack_15ee;
  undefined2 uStack_15ec;
  undefined2 uStack_15ea;
  undefined2 uStack_15e0;
  undefined2 uStack_15de;
  undefined2 uStack_15dc;
  undefined2 uStack_15da;
  undefined2 uStack_15d0;
  undefined2 uStack_15ce;
  undefined2 uStack_15cc;
  undefined2 uStack_15ca;
  undefined2 uStack_15c0;
  undefined2 uStack_15be;
  undefined2 uStack_15bc;
  undefined2 uStack_15ba;
  undefined2 uStack_15b0;
  undefined2 uStack_15ae;
  undefined2 uStack_15ac;
  undefined2 uStack_15aa;
  undefined2 uStack_15a0;
  undefined2 uStack_159e;
  undefined2 uStack_159c;
  undefined2 uStack_159a;
  undefined2 uStack_1590;
  undefined2 uStack_158e;
  undefined2 uStack_158c;
  undefined2 uStack_158a;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  int local_1058;
  int iStack_1054;
  int iStack_1050;
  int iStack_104c;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  int local_ff8;
  int iStack_ff4;
  int iStack_ff0;
  int iStack_fec;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  int local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  int local_e78;
  int iStack_e74;
  int iStack_e70;
  int iStack_e6c;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  int local_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int local_e18;
  int iStack_e14;
  int iStack_e10;
  int iStack_e0c;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_dd8;
  int iStack_dd4;
  int iStack_dd0;
  int iStack_dcc;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int local_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c38;
  int iStack_c34;
  int iStack_c30;
  int iStack_c2c;
  int local_c18;
  int iStack_c14;
  int iStack_c10;
  int iStack_c0c;
  int local_bf8;
  int iStack_bf4;
  int iStack_bf0;
  int iStack_bec;
  int local_bd8;
  int iStack_bd4;
  int iStack_bd0;
  int iStack_bcc;
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  
  piVar159 = cospi_arr(0xc);
  iVar141 = (uint)*(ushort *)(piVar159 + 0x3c) + piVar159[4] * -0x10000;
  uVar142 = (uint)*(ushort *)(piVar159 + 4) | piVar159[0x3c] << 0x10;
  iVar143 = (uint)*(ushort *)(piVar159 + 0x1c) + piVar159[0x24] * -0x10000;
  uVar144 = (uint)*(ushort *)(piVar159 + 0x24) | piVar159[0x1c] << 0x10;
  iVar145 = (uint)*(ushort *)(piVar159 + 0x2c) + piVar159[0x14] * -0x10000;
  uVar146 = (uint)*(ushort *)(piVar159 + 0x14) | piVar159[0x2c] << 0x10;
  iVar147 = (uint)*(ushort *)(piVar159 + 0xc) + piVar159[0x34] * -0x10000;
  uVar148 = (uint)*(ushort *)(piVar159 + 0x34) | piVar159[0xc] << 0x10;
  iVar149 = (uint)*(ushort *)(piVar159 + 0x38) + piVar159[8] * -0x10000;
  uVar150 = (uint)*(ushort *)(piVar159 + 8) | piVar159[0x38] << 0x10;
  iVar151 = (uint)*(ushort *)(piVar159 + 0x18) + piVar159[0x28] * -0x10000;
  uVar152 = (uint)*(ushort *)(piVar159 + 0x28) | piVar159[0x18] << 0x10;
  uVar153 = CONCAT22((short)piVar159[0x20],(short)piVar159[0x20]);
  iVar154 = (piVar159[0x20] & 0xffffU) + piVar159[0x20] * -0x10000;
  iVar155 = (uint)*(ushort *)(piVar159 + 0x30) + piVar159[0x10] * -0x10000;
  uVar156 = (uint)*(ushort *)(piVar159 + 0x10) | piVar159[0x30] << 0x10;
  uVar157 = -piVar159[0x10] & 0xffffU | piVar159[0x30] << 0x10;
  uVar139 = CONCAT44(uVar157,uVar157);
  uVar140 = CONCAT44(uVar157,uVar157);
  uVar157 = (uint)*(ushort *)(piVar159 + 0x30) | piVar159[0x10] << 0x10;
  iVar158 = (-piVar159[0x30] & 0xffffU) + piVar159[0x10] * -0x10000;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[0x10];
  uVar4 = in_RDI[0x11];
  uVar5 = in_RDI[8];
  uVar6 = in_RDI[9];
  uVar7 = in_RDI[0x18];
  uVar8 = in_RDI[0x19];
  uVar9 = in_RDI[4];
  uVar10 = in_RDI[5];
  uVar11 = in_RDI[0x14];
  uVar12 = in_RDI[0x15];
  uVar13 = in_RDI[0xc];
  uVar14 = in_RDI[0xd];
  uVar15 = in_RDI[0x1c];
  uVar16 = in_RDI[0x1d];
  uVar17 = in_RDI[2];
  uVar18 = in_RDI[3];
  uVar19 = in_RDI[0x12];
  uVar20 = in_RDI[0x13];
  uVar21 = in_RDI[10];
  uVar22 = in_RDI[0xb];
  uVar23 = in_RDI[0x1a];
  uVar24 = in_RDI[0x1b];
  uVar25 = in_RDI[6];
  uVar26 = in_RDI[7];
  uVar27 = in_RDI[0x16];
  uVar28 = in_RDI[0x17];
  uVar29 = in_RDI[0xe];
  uVar30 = in_RDI[0xf];
  uVar31 = in_RDI[0x1e];
  uVar32 = in_RDI[0x1f];
  local_16d8 = (undefined2)uVar17;
  uStack_16d6 = (undefined2)((ulong)uVar17 >> 0x10);
  uStack_16d4 = (undefined2)((ulong)uVar17 >> 0x20);
  uStack_16d2 = (undefined2)((ulong)uVar17 >> 0x30);
  local_16e8 = (undefined2)uVar31;
  uStack_16e6 = (undefined2)((ulong)uVar31 >> 0x10);
  uStack_16e4 = (undefined2)((ulong)uVar31 >> 0x20);
  uStack_16e2 = (undefined2)((ulong)uVar31 >> 0x30);
  uStack_1590 = (undefined2)uVar18;
  uStack_158e = (undefined2)((ulong)uVar18 >> 0x10);
  uStack_158c = (undefined2)((ulong)uVar18 >> 0x20);
  uStack_158a = (undefined2)((ulong)uVar18 >> 0x30);
  uStack_15a0 = (undefined2)uVar32;
  uStack_159e = (undefined2)((ulong)uVar32 >> 0x10);
  uStack_159c = (undefined2)((ulong)uVar32 >> 0x20);
  uStack_159a = (undefined2)((ulong)uVar32 >> 0x30);
  auVar98._2_2_ = local_16e8;
  auVar98._0_2_ = local_16d8;
  auVar98._4_2_ = uStack_16d6;
  auVar98._6_2_ = uStack_16e6;
  auVar98._10_2_ = uStack_16e4;
  auVar98._8_2_ = uStack_16d4;
  auVar98._12_2_ = uStack_16d2;
  auVar98._14_2_ = uStack_16e2;
  auVar97._8_8_ = CONCAT44(iVar141,iVar141);
  auVar97._0_8_ = CONCAT44(iVar141,iVar141);
  auVar160 = pmaddwd(auVar98,auVar97);
  auVar96._2_2_ = uStack_15a0;
  auVar96._0_2_ = uStack_1590;
  auVar96._4_2_ = uStack_158e;
  auVar96._6_2_ = uStack_159e;
  auVar96._10_2_ = uStack_159c;
  auVar96._8_2_ = uStack_158c;
  auVar96._12_2_ = uStack_158a;
  auVar96._14_2_ = uStack_159a;
  auVar95._8_8_ = CONCAT44(iVar141,iVar141);
  auVar95._0_8_ = CONCAT44(iVar141,iVar141);
  auVar161 = pmaddwd(auVar96,auVar95);
  auVar94._2_2_ = local_16e8;
  auVar94._0_2_ = local_16d8;
  auVar94._4_2_ = uStack_16d6;
  auVar94._6_2_ = uStack_16e6;
  auVar94._10_2_ = uStack_16e4;
  auVar94._8_2_ = uStack_16d4;
  auVar94._12_2_ = uStack_16d2;
  auVar94._14_2_ = uStack_16e2;
  auVar93._8_8_ = CONCAT44(uVar142,uVar142);
  auVar93._0_8_ = CONCAT44(uVar142,uVar142);
  auVar162 = pmaddwd(auVar94,auVar93);
  auVar92._2_2_ = uStack_15a0;
  auVar92._0_2_ = uStack_1590;
  auVar92._4_2_ = uStack_158e;
  auVar92._6_2_ = uStack_159e;
  auVar92._10_2_ = uStack_159c;
  auVar92._8_2_ = uStack_158c;
  auVar92._12_2_ = uStack_158a;
  auVar92._14_2_ = uStack_159a;
  auVar91._8_8_ = CONCAT44(uVar142,uVar142);
  auVar91._0_8_ = CONCAT44(uVar142,uVar142);
  auVar163 = pmaddwd(auVar92,auVar91);
  local_b98 = auVar160._0_4_;
  iStack_b94 = auVar160._4_4_;
  iStack_b90 = auVar160._8_4_;
  iStack_b8c = auVar160._12_4_;
  local_bb8 = auVar161._0_4_;
  iStack_bb4 = auVar161._4_4_;
  iStack_bb0 = auVar161._8_4_;
  iStack_bac = auVar161._12_4_;
  local_bd8 = auVar162._0_4_;
  iStack_bd4 = auVar162._4_4_;
  iStack_bd0 = auVar162._8_4_;
  iStack_bcc = auVar162._12_4_;
  local_bf8 = auVar163._0_4_;
  iStack_bf4 = auVar163._4_4_;
  iStack_bf0 = auVar163._8_4_;
  iStack_bec = auVar163._12_4_;
  auVar160 = ZEXT416(0xc);
  auVar161 = ZEXT416(0xc);
  auVar162 = ZEXT416(0xc);
  auVar163 = ZEXT416(0xc);
  auVar138._4_4_ = iStack_b94 + 0x800 >> auVar160;
  auVar138._0_4_ = local_b98 + 0x800 >> auVar160;
  auVar138._12_4_ = iStack_b8c + 0x800 >> auVar160;
  auVar138._8_4_ = iStack_b90 + 0x800 >> auVar160;
  auVar137._4_4_ = iStack_bb4 + 0x800 >> auVar161;
  auVar137._0_4_ = local_bb8 + 0x800 >> auVar161;
  auVar137._12_4_ = iStack_bac + 0x800 >> auVar161;
  auVar137._8_4_ = iStack_bb0 + 0x800 >> auVar161;
  auVar160 = packssdw(auVar138,auVar137);
  auVar136._4_4_ = iStack_bd4 + 0x800 >> auVar162;
  auVar136._0_4_ = local_bd8 + 0x800 >> auVar162;
  auVar136._12_4_ = iStack_bcc + 0x800 >> auVar162;
  auVar136._8_4_ = iStack_bd0 + 0x800 >> auVar162;
  auVar135._4_4_ = iStack_bf4 + 0x800 >> auVar163;
  auVar135._0_4_ = local_bf8 + 0x800 >> auVar163;
  auVar135._12_4_ = iStack_bec + 0x800 >> auVar163;
  auVar135._8_4_ = iStack_bf0 + 0x800 >> auVar163;
  auVar161 = packssdw(auVar136,auVar135);
  local_16f8 = (undefined2)uVar19;
  uStack_16f6 = (undefined2)((ulong)uVar19 >> 0x10);
  uStack_16f4 = (undefined2)((ulong)uVar19 >> 0x20);
  uStack_16f2 = (undefined2)((ulong)uVar19 >> 0x30);
  local_1708 = (undefined2)uVar29;
  uStack_1706 = (undefined2)((ulong)uVar29 >> 0x10);
  uStack_1704 = (undefined2)((ulong)uVar29 >> 0x20);
  uStack_1702 = (undefined2)((ulong)uVar29 >> 0x30);
  uStack_15b0 = (undefined2)uVar20;
  uStack_15ae = (undefined2)((ulong)uVar20 >> 0x10);
  uStack_15ac = (undefined2)((ulong)uVar20 >> 0x20);
  uStack_15aa = (undefined2)((ulong)uVar20 >> 0x30);
  uStack_15c0 = (undefined2)uVar30;
  uStack_15be = (undefined2)((ulong)uVar30 >> 0x10);
  uStack_15bc = (undefined2)((ulong)uVar30 >> 0x20);
  uStack_15ba = (undefined2)((ulong)uVar30 >> 0x30);
  auVar90._2_2_ = local_1708;
  auVar90._0_2_ = local_16f8;
  auVar90._4_2_ = uStack_16f6;
  auVar90._6_2_ = uStack_1706;
  auVar90._10_2_ = uStack_1704;
  auVar90._8_2_ = uStack_16f4;
  auVar90._12_2_ = uStack_16f2;
  auVar90._14_2_ = uStack_1702;
  auVar89._8_8_ = CONCAT44(iVar143,iVar143);
  auVar89._0_8_ = CONCAT44(iVar143,iVar143);
  auVar162 = pmaddwd(auVar90,auVar89);
  auVar88._2_2_ = uStack_15c0;
  auVar88._0_2_ = uStack_15b0;
  auVar88._4_2_ = uStack_15ae;
  auVar88._6_2_ = uStack_15be;
  auVar88._10_2_ = uStack_15bc;
  auVar88._8_2_ = uStack_15ac;
  auVar88._12_2_ = uStack_15aa;
  auVar88._14_2_ = uStack_15ba;
  auVar87._8_8_ = CONCAT44(iVar143,iVar143);
  auVar87._0_8_ = CONCAT44(iVar143,iVar143);
  auVar163 = pmaddwd(auVar88,auVar87);
  auVar86._2_2_ = local_1708;
  auVar86._0_2_ = local_16f8;
  auVar86._4_2_ = uStack_16f6;
  auVar86._6_2_ = uStack_1706;
  auVar86._10_2_ = uStack_1704;
  auVar86._8_2_ = uStack_16f4;
  auVar86._12_2_ = uStack_16f2;
  auVar86._14_2_ = uStack_1702;
  auVar85._8_8_ = CONCAT44(uVar144,uVar144);
  auVar85._0_8_ = CONCAT44(uVar144,uVar144);
  auVar164 = pmaddwd(auVar86,auVar85);
  auVar84._2_2_ = uStack_15c0;
  auVar84._0_2_ = uStack_15b0;
  auVar84._4_2_ = uStack_15ae;
  auVar84._6_2_ = uStack_15be;
  auVar84._10_2_ = uStack_15bc;
  auVar84._8_2_ = uStack_15ac;
  auVar84._12_2_ = uStack_15aa;
  auVar84._14_2_ = uStack_15ba;
  auVar83._8_8_ = CONCAT44(uVar144,uVar144);
  auVar83._0_8_ = CONCAT44(uVar144,uVar144);
  auVar165 = pmaddwd(auVar84,auVar83);
  local_c18 = auVar162._0_4_;
  iStack_c14 = auVar162._4_4_;
  iStack_c10 = auVar162._8_4_;
  iStack_c0c = auVar162._12_4_;
  local_c38 = auVar163._0_4_;
  iStack_c34 = auVar163._4_4_;
  iStack_c30 = auVar163._8_4_;
  iStack_c2c = auVar163._12_4_;
  local_c58 = auVar164._0_4_;
  iStack_c54 = auVar164._4_4_;
  iStack_c50 = auVar164._8_4_;
  iStack_c4c = auVar164._12_4_;
  local_c78 = auVar165._0_4_;
  iStack_c74 = auVar165._4_4_;
  iStack_c70 = auVar165._8_4_;
  iStack_c6c = auVar165._12_4_;
  auVar162 = ZEXT416(0xc);
  auVar163 = ZEXT416(0xc);
  auVar164 = ZEXT416(0xc);
  auVar165 = ZEXT416(0xc);
  auVar134._4_4_ = iStack_c14 + 0x800 >> auVar162;
  auVar134._0_4_ = local_c18 + 0x800 >> auVar162;
  auVar134._12_4_ = iStack_c0c + 0x800 >> auVar162;
  auVar134._8_4_ = iStack_c10 + 0x800 >> auVar162;
  auVar133._4_4_ = iStack_c34 + 0x800 >> auVar163;
  auVar133._0_4_ = local_c38 + 0x800 >> auVar163;
  auVar133._12_4_ = iStack_c2c + 0x800 >> auVar163;
  auVar133._8_4_ = iStack_c30 + 0x800 >> auVar163;
  auVar162 = packssdw(auVar134,auVar133);
  auVar132._4_4_ = iStack_c54 + 0x800 >> auVar164;
  auVar132._0_4_ = local_c58 + 0x800 >> auVar164;
  auVar132._12_4_ = iStack_c4c + 0x800 >> auVar164;
  auVar132._8_4_ = iStack_c50 + 0x800 >> auVar164;
  auVar131._4_4_ = iStack_c74 + 0x800 >> auVar165;
  auVar131._0_4_ = local_c78 + 0x800 >> auVar165;
  auVar131._12_4_ = iStack_c6c + 0x800 >> auVar165;
  auVar131._8_4_ = iStack_c70 + 0x800 >> auVar165;
  auVar163 = packssdw(auVar132,auVar131);
  local_1718 = (undefined2)uVar21;
  uStack_1716 = (undefined2)((ulong)uVar21 >> 0x10);
  uStack_1714 = (undefined2)((ulong)uVar21 >> 0x20);
  uStack_1712 = (undefined2)((ulong)uVar21 >> 0x30);
  local_1728 = (undefined2)uVar27;
  uStack_1726 = (undefined2)((ulong)uVar27 >> 0x10);
  uStack_1724 = (undefined2)((ulong)uVar27 >> 0x20);
  uStack_1722 = (undefined2)((ulong)uVar27 >> 0x30);
  uStack_15d0 = (undefined2)uVar22;
  uStack_15ce = (undefined2)((ulong)uVar22 >> 0x10);
  uStack_15cc = (undefined2)((ulong)uVar22 >> 0x20);
  uStack_15ca = (undefined2)((ulong)uVar22 >> 0x30);
  uStack_15e0 = (undefined2)uVar28;
  uStack_15de = (undefined2)((ulong)uVar28 >> 0x10);
  uStack_15dc = (undefined2)((ulong)uVar28 >> 0x20);
  uStack_15da = (undefined2)((ulong)uVar28 >> 0x30);
  auVar82._2_2_ = local_1728;
  auVar82._0_2_ = local_1718;
  auVar82._4_2_ = uStack_1716;
  auVar82._6_2_ = uStack_1726;
  auVar82._10_2_ = uStack_1724;
  auVar82._8_2_ = uStack_1714;
  auVar82._12_2_ = uStack_1712;
  auVar82._14_2_ = uStack_1722;
  auVar81._8_8_ = CONCAT44(iVar145,iVar145);
  auVar81._0_8_ = CONCAT44(iVar145,iVar145);
  auVar164 = pmaddwd(auVar82,auVar81);
  auVar80._2_2_ = uStack_15e0;
  auVar80._0_2_ = uStack_15d0;
  auVar80._4_2_ = uStack_15ce;
  auVar80._6_2_ = uStack_15de;
  auVar80._10_2_ = uStack_15dc;
  auVar80._8_2_ = uStack_15cc;
  auVar80._12_2_ = uStack_15ca;
  auVar80._14_2_ = uStack_15da;
  auVar79._8_8_ = CONCAT44(iVar145,iVar145);
  auVar79._0_8_ = CONCAT44(iVar145,iVar145);
  auVar165 = pmaddwd(auVar80,auVar79);
  auVar78._2_2_ = local_1728;
  auVar78._0_2_ = local_1718;
  auVar78._4_2_ = uStack_1716;
  auVar78._6_2_ = uStack_1726;
  auVar78._10_2_ = uStack_1724;
  auVar78._8_2_ = uStack_1714;
  auVar78._12_2_ = uStack_1712;
  auVar78._14_2_ = uStack_1722;
  auVar77._8_8_ = CONCAT44(uVar146,uVar146);
  auVar77._0_8_ = CONCAT44(uVar146,uVar146);
  auVar166 = pmaddwd(auVar78,auVar77);
  auVar76._2_2_ = uStack_15e0;
  auVar76._0_2_ = uStack_15d0;
  auVar76._4_2_ = uStack_15ce;
  auVar76._6_2_ = uStack_15de;
  auVar76._10_2_ = uStack_15dc;
  auVar76._8_2_ = uStack_15cc;
  auVar76._12_2_ = uStack_15ca;
  auVar76._14_2_ = uStack_15da;
  auVar75._8_8_ = CONCAT44(uVar146,uVar146);
  auVar75._0_8_ = CONCAT44(uVar146,uVar146);
  auVar167 = pmaddwd(auVar76,auVar75);
  local_c98 = auVar164._0_4_;
  iStack_c94 = auVar164._4_4_;
  iStack_c90 = auVar164._8_4_;
  iStack_c8c = auVar164._12_4_;
  local_cb8 = auVar165._0_4_;
  iStack_cb4 = auVar165._4_4_;
  iStack_cb0 = auVar165._8_4_;
  iStack_cac = auVar165._12_4_;
  local_cd8 = auVar166._0_4_;
  iStack_cd4 = auVar166._4_4_;
  iStack_cd0 = auVar166._8_4_;
  iStack_ccc = auVar166._12_4_;
  local_cf8 = auVar167._0_4_;
  iStack_cf4 = auVar167._4_4_;
  iStack_cf0 = auVar167._8_4_;
  iStack_cec = auVar167._12_4_;
  auVar164 = ZEXT416(0xc);
  auVar165 = ZEXT416(0xc);
  auVar166 = ZEXT416(0xc);
  auVar167 = ZEXT416(0xc);
  auVar130._4_4_ = iStack_c94 + 0x800 >> auVar164;
  auVar130._0_4_ = local_c98 + 0x800 >> auVar164;
  auVar130._12_4_ = iStack_c8c + 0x800 >> auVar164;
  auVar130._8_4_ = iStack_c90 + 0x800 >> auVar164;
  auVar129._4_4_ = iStack_cb4 + 0x800 >> auVar165;
  auVar129._0_4_ = local_cb8 + 0x800 >> auVar165;
  auVar129._12_4_ = iStack_cac + 0x800 >> auVar165;
  auVar129._8_4_ = iStack_cb0 + 0x800 >> auVar165;
  auVar164 = packssdw(auVar130,auVar129);
  auVar128._4_4_ = iStack_cd4 + 0x800 >> auVar166;
  auVar128._0_4_ = local_cd8 + 0x800 >> auVar166;
  auVar128._12_4_ = iStack_ccc + 0x800 >> auVar166;
  auVar128._8_4_ = iStack_cd0 + 0x800 >> auVar166;
  auVar127._4_4_ = iStack_cf4 + 0x800 >> auVar167;
  auVar127._0_4_ = local_cf8 + 0x800 >> auVar167;
  auVar127._12_4_ = iStack_cec + 0x800 >> auVar167;
  auVar127._8_4_ = iStack_cf0 + 0x800 >> auVar167;
  auVar165 = packssdw(auVar128,auVar127);
  local_1738 = (undefined2)uVar23;
  uStack_1736 = (undefined2)((ulong)uVar23 >> 0x10);
  uStack_1734 = (undefined2)((ulong)uVar23 >> 0x20);
  uStack_1732 = (undefined2)((ulong)uVar23 >> 0x30);
  local_1748 = (undefined2)uVar25;
  uStack_1746 = (undefined2)((ulong)uVar25 >> 0x10);
  uStack_1744 = (undefined2)((ulong)uVar25 >> 0x20);
  uStack_1742 = (undefined2)((ulong)uVar25 >> 0x30);
  uStack_15f0 = (undefined2)uVar24;
  uStack_15ee = (undefined2)((ulong)uVar24 >> 0x10);
  uStack_15ec = (undefined2)((ulong)uVar24 >> 0x20);
  uStack_15ea = (undefined2)((ulong)uVar24 >> 0x30);
  uStack_1600 = (undefined2)uVar26;
  uStack_15fe = (undefined2)((ulong)uVar26 >> 0x10);
  uStack_15fc = (undefined2)((ulong)uVar26 >> 0x20);
  uStack_15fa = (undefined2)((ulong)uVar26 >> 0x30);
  auVar74._2_2_ = local_1748;
  auVar74._0_2_ = local_1738;
  auVar74._4_2_ = uStack_1736;
  auVar74._6_2_ = uStack_1746;
  auVar74._10_2_ = uStack_1744;
  auVar74._8_2_ = uStack_1734;
  auVar74._12_2_ = uStack_1732;
  auVar74._14_2_ = uStack_1742;
  auVar73._8_8_ = CONCAT44(iVar147,iVar147);
  auVar73._0_8_ = CONCAT44(iVar147,iVar147);
  auVar166 = pmaddwd(auVar74,auVar73);
  auVar72._2_2_ = uStack_1600;
  auVar72._0_2_ = uStack_15f0;
  auVar72._4_2_ = uStack_15ee;
  auVar72._6_2_ = uStack_15fe;
  auVar72._10_2_ = uStack_15fc;
  auVar72._8_2_ = uStack_15ec;
  auVar72._12_2_ = uStack_15ea;
  auVar72._14_2_ = uStack_15fa;
  auVar71._8_8_ = CONCAT44(iVar147,iVar147);
  auVar71._0_8_ = CONCAT44(iVar147,iVar147);
  auVar167 = pmaddwd(auVar72,auVar71);
  auVar70._2_2_ = local_1748;
  auVar70._0_2_ = local_1738;
  auVar70._4_2_ = uStack_1736;
  auVar70._6_2_ = uStack_1746;
  auVar70._10_2_ = uStack_1744;
  auVar70._8_2_ = uStack_1734;
  auVar70._12_2_ = uStack_1732;
  auVar70._14_2_ = uStack_1742;
  auVar69._8_8_ = CONCAT44(uVar148,uVar148);
  auVar69._0_8_ = CONCAT44(uVar148,uVar148);
  auVar168 = pmaddwd(auVar70,auVar69);
  auVar68._2_2_ = uStack_1600;
  auVar68._0_2_ = uStack_15f0;
  auVar68._4_2_ = uStack_15ee;
  auVar68._6_2_ = uStack_15fe;
  auVar68._10_2_ = uStack_15fc;
  auVar68._8_2_ = uStack_15ec;
  auVar68._12_2_ = uStack_15ea;
  auVar68._14_2_ = uStack_15fa;
  auVar67._8_8_ = CONCAT44(uVar148,uVar148);
  auVar67._0_8_ = CONCAT44(uVar148,uVar148);
  auVar169 = pmaddwd(auVar68,auVar67);
  local_d18 = auVar166._0_4_;
  iStack_d14 = auVar166._4_4_;
  iStack_d10 = auVar166._8_4_;
  iStack_d0c = auVar166._12_4_;
  local_d38 = auVar167._0_4_;
  iStack_d34 = auVar167._4_4_;
  iStack_d30 = auVar167._8_4_;
  iStack_d2c = auVar167._12_4_;
  local_d58 = auVar168._0_4_;
  iStack_d54 = auVar168._4_4_;
  iStack_d50 = auVar168._8_4_;
  iStack_d4c = auVar168._12_4_;
  local_d78 = auVar169._0_4_;
  iStack_d74 = auVar169._4_4_;
  iStack_d70 = auVar169._8_4_;
  iStack_d6c = auVar169._12_4_;
  auVar166 = ZEXT416(0xc);
  auVar167 = ZEXT416(0xc);
  auVar168 = ZEXT416(0xc);
  auVar169 = ZEXT416(0xc);
  auVar126._4_4_ = iStack_d14 + 0x800 >> auVar166;
  auVar126._0_4_ = local_d18 + 0x800 >> auVar166;
  auVar126._12_4_ = iStack_d0c + 0x800 >> auVar166;
  auVar126._8_4_ = iStack_d10 + 0x800 >> auVar166;
  auVar125._4_4_ = iStack_d34 + 0x800 >> auVar167;
  auVar125._0_4_ = local_d38 + 0x800 >> auVar167;
  auVar125._12_4_ = iStack_d2c + 0x800 >> auVar167;
  auVar125._8_4_ = iStack_d30 + 0x800 >> auVar167;
  auVar166 = packssdw(auVar126,auVar125);
  auVar124._4_4_ = iStack_d54 + 0x800 >> auVar168;
  auVar124._0_4_ = local_d58 + 0x800 >> auVar168;
  auVar124._12_4_ = iStack_d4c + 0x800 >> auVar168;
  auVar124._8_4_ = iStack_d50 + 0x800 >> auVar168;
  auVar123._4_4_ = iStack_d74 + 0x800 >> auVar169;
  auVar123._0_4_ = local_d78 + 0x800 >> auVar169;
  auVar123._12_4_ = iStack_d6c + 0x800 >> auVar169;
  auVar123._8_4_ = iStack_d70 + 0x800 >> auVar169;
  auVar167 = packssdw(auVar124,auVar123);
  local_1758 = (undefined2)uVar9;
  uStack_1756 = (undefined2)((ulong)uVar9 >> 0x10);
  uStack_1754 = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_1752 = (undefined2)((ulong)uVar9 >> 0x30);
  local_1768 = (undefined2)uVar15;
  uStack_1766 = (undefined2)((ulong)uVar15 >> 0x10);
  uStack_1764 = (undefined2)((ulong)uVar15 >> 0x20);
  uStack_1762 = (undefined2)((ulong)uVar15 >> 0x30);
  uStack_1610 = (undefined2)uVar10;
  uStack_160e = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_160c = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_160a = (undefined2)((ulong)uVar10 >> 0x30);
  uStack_1620 = (undefined2)uVar16;
  uStack_161e = (undefined2)((ulong)uVar16 >> 0x10);
  uStack_161c = (undefined2)((ulong)uVar16 >> 0x20);
  uStack_161a = (undefined2)((ulong)uVar16 >> 0x30);
  auVar66._2_2_ = local_1768;
  auVar66._0_2_ = local_1758;
  auVar66._4_2_ = uStack_1756;
  auVar66._6_2_ = uStack_1766;
  auVar66._10_2_ = uStack_1764;
  auVar66._8_2_ = uStack_1754;
  auVar66._12_2_ = uStack_1752;
  auVar66._14_2_ = uStack_1762;
  auVar65._8_8_ = CONCAT44(iVar149,iVar149);
  auVar65._0_8_ = CONCAT44(iVar149,iVar149);
  auVar168 = pmaddwd(auVar66,auVar65);
  auVar64._2_2_ = uStack_1620;
  auVar64._0_2_ = uStack_1610;
  auVar64._4_2_ = uStack_160e;
  auVar64._6_2_ = uStack_161e;
  auVar64._10_2_ = uStack_161c;
  auVar64._8_2_ = uStack_160c;
  auVar64._12_2_ = uStack_160a;
  auVar64._14_2_ = uStack_161a;
  auVar63._8_8_ = CONCAT44(iVar149,iVar149);
  auVar63._0_8_ = CONCAT44(iVar149,iVar149);
  auVar169 = pmaddwd(auVar64,auVar63);
  auVar62._2_2_ = local_1768;
  auVar62._0_2_ = local_1758;
  auVar62._4_2_ = uStack_1756;
  auVar62._6_2_ = uStack_1766;
  auVar62._10_2_ = uStack_1764;
  auVar62._8_2_ = uStack_1754;
  auVar62._12_2_ = uStack_1752;
  auVar62._14_2_ = uStack_1762;
  auVar61._8_8_ = CONCAT44(uVar150,uVar150);
  auVar61._0_8_ = CONCAT44(uVar150,uVar150);
  auVar170 = pmaddwd(auVar62,auVar61);
  auVar60._2_2_ = uStack_1620;
  auVar60._0_2_ = uStack_1610;
  auVar60._4_2_ = uStack_160e;
  auVar60._6_2_ = uStack_161e;
  auVar60._10_2_ = uStack_161c;
  auVar60._8_2_ = uStack_160c;
  auVar60._12_2_ = uStack_160a;
  auVar60._14_2_ = uStack_161a;
  auVar59._8_8_ = CONCAT44(uVar150,uVar150);
  auVar59._0_8_ = CONCAT44(uVar150,uVar150);
  auVar171 = pmaddwd(auVar60,auVar59);
  local_d98 = auVar168._0_4_;
  iStack_d94 = auVar168._4_4_;
  iStack_d90 = auVar168._8_4_;
  iStack_d8c = auVar168._12_4_;
  local_db8 = auVar169._0_4_;
  iStack_db4 = auVar169._4_4_;
  iStack_db0 = auVar169._8_4_;
  iStack_dac = auVar169._12_4_;
  local_dd8 = auVar170._0_4_;
  iStack_dd4 = auVar170._4_4_;
  iStack_dd0 = auVar170._8_4_;
  iStack_dcc = auVar170._12_4_;
  local_df8 = auVar171._0_4_;
  iStack_df4 = auVar171._4_4_;
  iStack_df0 = auVar171._8_4_;
  iStack_dec = auVar171._12_4_;
  auVar168 = ZEXT416(0xc);
  auVar169 = ZEXT416(0xc);
  auVar170 = ZEXT416(0xc);
  auVar171 = ZEXT416(0xc);
  auVar122._4_4_ = iStack_d94 + 0x800 >> auVar168;
  auVar122._0_4_ = local_d98 + 0x800 >> auVar168;
  auVar122._12_4_ = iStack_d8c + 0x800 >> auVar168;
  auVar122._8_4_ = iStack_d90 + 0x800 >> auVar168;
  auVar121._4_4_ = iStack_db4 + 0x800 >> auVar169;
  auVar121._0_4_ = local_db8 + 0x800 >> auVar169;
  auVar121._12_4_ = iStack_dac + 0x800 >> auVar169;
  auVar121._8_4_ = iStack_db0 + 0x800 >> auVar169;
  auVar168 = packssdw(auVar122,auVar121);
  auVar120._4_4_ = iStack_dd4 + 0x800 >> auVar170;
  auVar120._0_4_ = local_dd8 + 0x800 >> auVar170;
  auVar120._12_4_ = iStack_dcc + 0x800 >> auVar170;
  auVar120._8_4_ = iStack_dd0 + 0x800 >> auVar170;
  auVar119._4_4_ = iStack_df4 + 0x800 >> auVar171;
  auVar119._0_4_ = local_df8 + 0x800 >> auVar171;
  auVar119._12_4_ = iStack_dec + 0x800 >> auVar171;
  auVar119._8_4_ = iStack_df0 + 0x800 >> auVar171;
  auVar169 = packssdw(auVar120,auVar119);
  local_1778 = (undefined2)uVar11;
  uStack_1776 = (undefined2)((ulong)uVar11 >> 0x10);
  uStack_1774 = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_1772 = (undefined2)((ulong)uVar11 >> 0x30);
  local_1788 = (undefined2)uVar13;
  uStack_1786 = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_1784 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_1782 = (undefined2)((ulong)uVar13 >> 0x30);
  uStack_1630 = (undefined2)uVar12;
  uStack_162e = (undefined2)((ulong)uVar12 >> 0x10);
  uStack_162c = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_162a = (undefined2)((ulong)uVar12 >> 0x30);
  uStack_1640 = (undefined2)uVar14;
  uStack_163e = (undefined2)((ulong)uVar14 >> 0x10);
  uStack_163c = (undefined2)((ulong)uVar14 >> 0x20);
  uStack_163a = (undefined2)((ulong)uVar14 >> 0x30);
  auVar58._2_2_ = local_1788;
  auVar58._0_2_ = local_1778;
  auVar58._4_2_ = uStack_1776;
  auVar58._6_2_ = uStack_1786;
  auVar58._10_2_ = uStack_1784;
  auVar58._8_2_ = uStack_1774;
  auVar58._12_2_ = uStack_1772;
  auVar58._14_2_ = uStack_1782;
  auVar57._8_8_ = CONCAT44(iVar151,iVar151);
  auVar57._0_8_ = CONCAT44(iVar151,iVar151);
  auVar170 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = uStack_1640;
  auVar56._0_2_ = uStack_1630;
  auVar56._4_2_ = uStack_162e;
  auVar56._6_2_ = uStack_163e;
  auVar56._10_2_ = uStack_163c;
  auVar56._8_2_ = uStack_162c;
  auVar56._12_2_ = uStack_162a;
  auVar56._14_2_ = uStack_163a;
  auVar55._8_8_ = CONCAT44(iVar151,iVar151);
  auVar55._0_8_ = CONCAT44(iVar151,iVar151);
  auVar171 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = local_1788;
  auVar54._0_2_ = local_1778;
  auVar54._4_2_ = uStack_1776;
  auVar54._6_2_ = uStack_1786;
  auVar54._10_2_ = uStack_1784;
  auVar54._8_2_ = uStack_1774;
  auVar54._12_2_ = uStack_1772;
  auVar54._14_2_ = uStack_1782;
  auVar53._8_8_ = CONCAT44(uVar152,uVar152);
  auVar53._0_8_ = CONCAT44(uVar152,uVar152);
  auVar172 = pmaddwd(auVar54,auVar53);
  auVar52._2_2_ = uStack_1640;
  auVar52._0_2_ = uStack_1630;
  auVar52._4_2_ = uStack_162e;
  auVar52._6_2_ = uStack_163e;
  auVar52._10_2_ = uStack_163c;
  auVar52._8_2_ = uStack_162c;
  auVar52._12_2_ = uStack_162a;
  auVar52._14_2_ = uStack_163a;
  auVar51._8_8_ = CONCAT44(uVar152,uVar152);
  auVar51._0_8_ = CONCAT44(uVar152,uVar152);
  auVar173 = pmaddwd(auVar52,auVar51);
  local_e18 = auVar170._0_4_;
  iStack_e14 = auVar170._4_4_;
  iStack_e10 = auVar170._8_4_;
  iStack_e0c = auVar170._12_4_;
  local_e38 = auVar171._0_4_;
  iStack_e34 = auVar171._4_4_;
  iStack_e30 = auVar171._8_4_;
  iStack_e2c = auVar171._12_4_;
  local_e58 = auVar172._0_4_;
  iStack_e54 = auVar172._4_4_;
  iStack_e50 = auVar172._8_4_;
  iStack_e4c = auVar172._12_4_;
  local_e78 = auVar173._0_4_;
  iStack_e74 = auVar173._4_4_;
  iStack_e70 = auVar173._8_4_;
  iStack_e6c = auVar173._12_4_;
  auVar170 = ZEXT416(0xc);
  auVar171 = ZEXT416(0xc);
  auVar172 = ZEXT416(0xc);
  auVar173 = ZEXT416(0xc);
  auVar118._4_4_ = iStack_e14 + 0x800 >> auVar170;
  auVar118._0_4_ = local_e18 + 0x800 >> auVar170;
  auVar118._12_4_ = iStack_e0c + 0x800 >> auVar170;
  auVar118._8_4_ = iStack_e10 + 0x800 >> auVar170;
  auVar117._4_4_ = iStack_e34 + 0x800 >> auVar171;
  auVar117._0_4_ = local_e38 + 0x800 >> auVar171;
  auVar117._12_4_ = iStack_e2c + 0x800 >> auVar171;
  auVar117._8_4_ = iStack_e30 + 0x800 >> auVar171;
  auVar170 = packssdw(auVar118,auVar117);
  auVar116._4_4_ = iStack_e54 + 0x800 >> auVar172;
  auVar116._0_4_ = local_e58 + 0x800 >> auVar172;
  auVar116._12_4_ = iStack_e4c + 0x800 >> auVar172;
  auVar116._8_4_ = iStack_e50 + 0x800 >> auVar172;
  auVar115._4_4_ = iStack_e74 + 0x800 >> auVar173;
  auVar115._0_4_ = local_e78 + 0x800 >> auVar173;
  auVar115._12_4_ = iStack_e6c + 0x800 >> auVar173;
  auVar115._8_4_ = iStack_e70 + 0x800 >> auVar173;
  auVar171 = packssdw(auVar116,auVar115);
  paddsw(auVar160,auVar162);
  auVar160 = psubsw(auVar160,auVar162);
  auVar162 = psubsw(auVar166,auVar164);
  paddsw(auVar166,auVar164);
  paddsw(auVar167,auVar165);
  auVar164 = psubsw(auVar167,auVar165);
  auVar165 = psubsw(auVar161,auVar163);
  paddsw(auVar161,auVar163);
  local_1798 = (undefined2)uVar1;
  uStack_1796 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1794 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1792 = (undefined2)((ulong)uVar1 >> 0x30);
  local_17a8 = (undefined2)uVar3;
  uStack_17a6 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_17a4 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_17a2 = (undefined2)((ulong)uVar3 >> 0x30);
  uStack_1650 = (undefined2)uVar2;
  uStack_164e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_164c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_164a = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_1660 = (undefined2)uVar4;
  uStack_165e = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_165c = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_165a = (undefined2)((ulong)uVar4 >> 0x30);
  auVar50._2_2_ = local_17a8;
  auVar50._0_2_ = local_1798;
  auVar50._4_2_ = uStack_1796;
  auVar50._6_2_ = uStack_17a6;
  auVar50._10_2_ = uStack_17a4;
  auVar50._8_2_ = uStack_1794;
  auVar50._12_2_ = uStack_1792;
  auVar50._14_2_ = uStack_17a2;
  auVar49._8_8_ = CONCAT44(uVar153,uVar153);
  auVar49._0_8_ = CONCAT44(uVar153,uVar153);
  auVar161 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = uStack_1660;
  auVar48._0_2_ = uStack_1650;
  auVar48._4_2_ = uStack_164e;
  auVar48._6_2_ = uStack_165e;
  auVar48._10_2_ = uStack_165c;
  auVar48._8_2_ = uStack_164c;
  auVar48._12_2_ = uStack_164a;
  auVar48._14_2_ = uStack_165a;
  auVar47._8_8_ = CONCAT44(uVar153,uVar153);
  auVar47._0_8_ = CONCAT44(uVar153,uVar153);
  auVar163 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = local_17a8;
  auVar46._0_2_ = local_1798;
  auVar46._4_2_ = uStack_1796;
  auVar46._6_2_ = uStack_17a6;
  auVar46._10_2_ = uStack_17a4;
  auVar46._8_2_ = uStack_1794;
  auVar46._12_2_ = uStack_1792;
  auVar46._14_2_ = uStack_17a2;
  auVar45._8_8_ = CONCAT44(iVar154,iVar154);
  auVar45._0_8_ = CONCAT44(iVar154,iVar154);
  auVar166 = pmaddwd(auVar46,auVar45);
  auVar44._2_2_ = uStack_1660;
  auVar44._0_2_ = uStack_1650;
  auVar44._4_2_ = uStack_164e;
  auVar44._6_2_ = uStack_165e;
  auVar44._10_2_ = uStack_165c;
  auVar44._8_2_ = uStack_164c;
  auVar44._12_2_ = uStack_164a;
  auVar44._14_2_ = uStack_165a;
  auVar43._8_8_ = CONCAT44(iVar154,iVar154);
  auVar43._0_8_ = CONCAT44(iVar154,iVar154);
  auVar167 = pmaddwd(auVar44,auVar43);
  local_e98 = auVar161._0_4_;
  iStack_e94 = auVar161._4_4_;
  iStack_e90 = auVar161._8_4_;
  iStack_e8c = auVar161._12_4_;
  local_eb8 = auVar163._0_4_;
  iStack_eb4 = auVar163._4_4_;
  iStack_eb0 = auVar163._8_4_;
  iStack_eac = auVar163._12_4_;
  local_ed8 = auVar166._0_4_;
  iStack_ed4 = auVar166._4_4_;
  iStack_ed0 = auVar166._8_4_;
  iStack_ecc = auVar166._12_4_;
  local_ef8 = auVar167._0_4_;
  iStack_ef4 = auVar167._4_4_;
  iStack_ef0 = auVar167._8_4_;
  iStack_eec = auVar167._12_4_;
  auVar161 = ZEXT416(0xc);
  auVar163 = ZEXT416(0xc);
  auVar166 = ZEXT416(0xc);
  auVar167 = ZEXT416(0xc);
  auVar114._4_4_ = iStack_e94 + 0x800 >> auVar161;
  auVar114._0_4_ = local_e98 + 0x800 >> auVar161;
  auVar114._12_4_ = iStack_e8c + 0x800 >> auVar161;
  auVar114._8_4_ = iStack_e90 + 0x800 >> auVar161;
  auVar113._4_4_ = iStack_eb4 + 0x800 >> auVar163;
  auVar113._0_4_ = local_eb8 + 0x800 >> auVar163;
  auVar113._12_4_ = iStack_eac + 0x800 >> auVar163;
  auVar113._8_4_ = iStack_eb0 + 0x800 >> auVar163;
  packssdw(auVar114,auVar113);
  auVar112._4_4_ = iStack_ed4 + 0x800 >> auVar166;
  auVar112._0_4_ = local_ed8 + 0x800 >> auVar166;
  auVar112._12_4_ = iStack_ecc + 0x800 >> auVar166;
  auVar112._8_4_ = iStack_ed0 + 0x800 >> auVar166;
  auVar111._4_4_ = iStack_ef4 + 0x800 >> auVar167;
  auVar111._0_4_ = local_ef8 + 0x800 >> auVar167;
  auVar111._12_4_ = iStack_eec + 0x800 >> auVar167;
  auVar111._8_4_ = iStack_ef0 + 0x800 >> auVar167;
  packssdw(auVar112,auVar111);
  local_17b8 = (undefined2)uVar5;
  uStack_17b6 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_17b4 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_17b2 = (undefined2)((ulong)uVar5 >> 0x30);
  local_17c8 = (undefined2)uVar7;
  uStack_17c6 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_17c4 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_17c2 = (undefined2)((ulong)uVar7 >> 0x30);
  uStack_1670 = (undefined2)uVar6;
  uStack_166e = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_166c = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_166a = (undefined2)((ulong)uVar6 >> 0x30);
  uStack_1680 = (undefined2)uVar8;
  uStack_167e = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_167c = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_167a = (undefined2)((ulong)uVar8 >> 0x30);
  auVar42._2_2_ = local_17c8;
  auVar42._0_2_ = local_17b8;
  auVar42._4_2_ = uStack_17b6;
  auVar42._6_2_ = uStack_17c6;
  auVar42._10_2_ = uStack_17c4;
  auVar42._8_2_ = uStack_17b4;
  auVar42._12_2_ = uStack_17b2;
  auVar42._14_2_ = uStack_17c2;
  auVar41._8_8_ = CONCAT44(iVar155,iVar155);
  auVar41._0_8_ = CONCAT44(iVar155,iVar155);
  auVar161 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = uStack_1680;
  auVar40._0_2_ = uStack_1670;
  auVar40._4_2_ = uStack_166e;
  auVar40._6_2_ = uStack_167e;
  auVar40._10_2_ = uStack_167c;
  auVar40._8_2_ = uStack_166c;
  auVar40._12_2_ = uStack_166a;
  auVar40._14_2_ = uStack_167a;
  auVar39._8_8_ = CONCAT44(iVar155,iVar155);
  auVar39._0_8_ = CONCAT44(iVar155,iVar155);
  auVar163 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = local_17c8;
  auVar38._0_2_ = local_17b8;
  auVar38._4_2_ = uStack_17b6;
  auVar38._6_2_ = uStack_17c6;
  auVar38._10_2_ = uStack_17c4;
  auVar38._8_2_ = uStack_17b4;
  auVar38._12_2_ = uStack_17b2;
  auVar38._14_2_ = uStack_17c2;
  auVar37._8_8_ = CONCAT44(uVar156,uVar156);
  auVar37._0_8_ = CONCAT44(uVar156,uVar156);
  auVar166 = pmaddwd(auVar38,auVar37);
  auVar36._2_2_ = uStack_1680;
  auVar36._0_2_ = uStack_1670;
  auVar36._4_2_ = uStack_166e;
  auVar36._6_2_ = uStack_167e;
  auVar36._10_2_ = uStack_167c;
  auVar36._8_2_ = uStack_166c;
  auVar36._12_2_ = uStack_166a;
  auVar36._14_2_ = uStack_167a;
  auVar35._8_8_ = CONCAT44(uVar156,uVar156);
  auVar35._0_8_ = CONCAT44(uVar156,uVar156);
  auVar167 = pmaddwd(auVar36,auVar35);
  local_f18 = auVar161._0_4_;
  iStack_f14 = auVar161._4_4_;
  iStack_f10 = auVar161._8_4_;
  iStack_f0c = auVar161._12_4_;
  local_f38 = auVar163._0_4_;
  iStack_f34 = auVar163._4_4_;
  iStack_f30 = auVar163._8_4_;
  iStack_f2c = auVar163._12_4_;
  local_f58 = auVar166._0_4_;
  iStack_f54 = auVar166._4_4_;
  iStack_f50 = auVar166._8_4_;
  iStack_f4c = auVar166._12_4_;
  local_f78 = auVar167._0_4_;
  iStack_f74 = auVar167._4_4_;
  iStack_f70 = auVar167._8_4_;
  iStack_f6c = auVar167._12_4_;
  auVar161 = ZEXT416(0xc);
  auVar163 = ZEXT416(0xc);
  auVar166 = ZEXT416(0xc);
  auVar167 = ZEXT416(0xc);
  iVar141 = local_f78 + 0x800 >> auVar167;
  iVar143 = iStack_f74 + 0x800 >> auVar167;
  iVar145 = iStack_f70 + 0x800 >> auVar167;
  iVar147 = iStack_f6c + 0x800 >> auVar167;
  auVar110._4_4_ = iStack_f14 + 0x800 >> auVar161;
  auVar110._0_4_ = local_f18 + 0x800 >> auVar161;
  auVar110._12_4_ = iStack_f0c + 0x800 >> auVar161;
  auVar110._8_4_ = iStack_f10 + 0x800 >> auVar161;
  auVar109._4_4_ = iStack_f34 + 0x800 >> auVar163;
  auVar109._0_4_ = local_f38 + 0x800 >> auVar163;
  auVar109._12_4_ = iStack_f2c + 0x800 >> auVar163;
  auVar109._8_4_ = iStack_f30 + 0x800 >> auVar163;
  packssdw(auVar110,auVar109);
  auVar108._4_4_ = iStack_f54 + 0x800 >> auVar166;
  auVar108._0_4_ = local_f58 + 0x800 >> auVar166;
  auVar108._12_4_ = iStack_f4c + 0x800 >> auVar166;
  auVar108._8_4_ = iStack_f50 + 0x800 >> auVar166;
  auVar107._4_4_ = iVar143;
  auVar107._0_4_ = iVar141;
  auVar107._12_4_ = iVar147;
  auVar107._8_4_ = iVar145;
  packssdw(auVar108,auVar107);
  local_1a78 = auVar168._0_8_;
  iStack_1a61 = auVar170[7];
  lStack_1a60 = auVar170._8_8_;
  paddsw(auVar168,auVar170);
  psubsw(auVar168,auVar170);
  psubsw(auVar169,auVar171);
  paddsw(auVar169,auVar171);
  local_17d8 = auVar160._0_2_;
  uStack_17d6 = auVar160._2_2_;
  uStack_17d4 = auVar160._4_2_;
  uStack_17d2 = auVar160._6_2_;
  local_17e8 = auVar165._0_2_;
  uStack_17e6 = auVar165._2_2_;
  uStack_17e4 = auVar165._4_2_;
  uStack_17e2 = auVar165._6_2_;
  uStack_1690 = auVar160._8_2_;
  uStack_168e = auVar160._10_2_;
  uStack_168c = auVar160._12_2_;
  uStack_168a = auVar160._14_2_;
  uStack_16a0 = auVar165._8_2_;
  uStack_169e = auVar165._10_2_;
  uStack_169c = auVar165._12_2_;
  uStack_169a = auVar165._14_2_;
  auVar34._2_2_ = local_17e8;
  auVar34._0_2_ = local_17d8;
  auVar34._4_2_ = uStack_17d6;
  auVar34._6_2_ = uStack_17e6;
  auVar34._10_2_ = uStack_17e4;
  auVar34._8_2_ = uStack_17d4;
  auVar34._12_2_ = uStack_17d2;
  auVar34._14_2_ = uStack_17e2;
  auVar33._8_8_ = uVar140;
  auVar33._0_8_ = uVar139;
  auVar160 = pmaddwd(auVar34,auVar33);
  auVar173._2_2_ = uStack_16a0;
  auVar173._0_2_ = uStack_1690;
  auVar173._4_2_ = uStack_168e;
  auVar173._6_2_ = uStack_169e;
  auVar173._10_2_ = uStack_169c;
  auVar173._8_2_ = uStack_168c;
  auVar173._12_2_ = uStack_168a;
  auVar173._14_2_ = uStack_169a;
  auVar172._8_8_ = uVar140;
  auVar172._0_8_ = uVar139;
  auVar161 = pmaddwd(auVar173,auVar172);
  auVar171._2_2_ = local_17e8;
  auVar171._0_2_ = local_17d8;
  auVar171._4_2_ = uStack_17d6;
  auVar171._6_2_ = uStack_17e6;
  auVar171._10_2_ = uStack_17e4;
  auVar171._8_2_ = uStack_17d4;
  auVar171._12_2_ = uStack_17d2;
  auVar171._14_2_ = uStack_17e2;
  auVar170._8_8_ = CONCAT44(uVar157,uVar157);
  auVar170._0_8_ = CONCAT44(uVar157,uVar157);
  auVar163 = pmaddwd(auVar171,auVar170);
  auVar169._2_2_ = uStack_16a0;
  auVar169._0_2_ = uStack_1690;
  auVar169._4_2_ = uStack_168e;
  auVar169._6_2_ = uStack_169e;
  auVar169._10_2_ = uStack_169c;
  auVar169._8_2_ = uStack_168c;
  auVar169._12_2_ = uStack_168a;
  auVar169._14_2_ = uStack_169a;
  auVar168._8_8_ = CONCAT44(uVar157,uVar157);
  auVar168._0_8_ = CONCAT44(uVar157,uVar157);
  auVar168 = pmaddwd(auVar169,auVar168);
  local_f98 = auVar160._0_4_;
  iStack_f94 = auVar160._4_4_;
  iStack_f90 = auVar160._8_4_;
  iStack_f8c = auVar160._12_4_;
  local_fb8 = auVar161._0_4_;
  iStack_fb4 = auVar161._4_4_;
  iStack_fb0 = auVar161._8_4_;
  iStack_fac = auVar161._12_4_;
  local_fd8 = auVar163._0_4_;
  iStack_fd4 = auVar163._4_4_;
  iStack_fd0 = auVar163._8_4_;
  iStack_fcc = auVar163._12_4_;
  local_ff8 = auVar168._0_4_;
  iStack_ff4 = auVar168._4_4_;
  iStack_ff0 = auVar168._8_4_;
  iStack_fec = auVar168._12_4_;
  auVar160 = ZEXT416(0xc);
  auVar161 = ZEXT416(0xc);
  auVar163 = ZEXT416(0xc);
  auVar165 = ZEXT416(0xc);
  auVar106._4_4_ = iStack_f94 + 0x800 >> auVar160;
  auVar106._0_4_ = local_f98 + 0x800 >> auVar160;
  auVar106._12_4_ = iStack_f8c + 0x800 >> auVar160;
  auVar106._8_4_ = iStack_f90 + 0x800 >> auVar160;
  auVar105._4_4_ = iStack_fb4 + 0x800 >> auVar161;
  auVar105._0_4_ = local_fb8 + 0x800 >> auVar161;
  auVar105._12_4_ = iStack_fac + 0x800 >> auVar161;
  auVar105._8_4_ = iStack_fb0 + 0x800 >> auVar161;
  packssdw(auVar106,auVar105);
  auVar104._4_4_ = iStack_fd4 + 0x800 >> auVar163;
  auVar104._0_4_ = local_fd8 + 0x800 >> auVar163;
  auVar104._12_4_ = iStack_fcc + 0x800 >> auVar163;
  auVar104._8_4_ = iStack_fd0 + 0x800 >> auVar163;
  auVar103._4_4_ = iStack_ff4 + 0x800 >> auVar165;
  auVar103._0_4_ = local_ff8 + 0x800 >> auVar165;
  auVar103._12_4_ = iStack_fec + 0x800 >> auVar165;
  auVar103._8_4_ = iStack_ff0 + 0x800 >> auVar165;
  packssdw(auVar104,auVar103);
  local_17f8 = auVar162._0_2_;
  uStack_17f6 = auVar162._2_2_;
  uStack_17f4 = auVar162._4_2_;
  uStack_17f2 = auVar162._6_2_;
  local_1808 = auVar164._0_2_;
  uStack_1806 = auVar164._2_2_;
  uStack_1804 = auVar164._4_2_;
  uStack_1802 = auVar164._6_2_;
  uStack_16b0 = auVar162._8_2_;
  uStack_16ae = auVar162._10_2_;
  uStack_16ac = auVar162._12_2_;
  uStack_16aa = auVar162._14_2_;
  uStack_16c0 = auVar164._8_2_;
  uStack_16be = auVar164._10_2_;
  uStack_16bc = auVar164._12_2_;
  uStack_16ba = auVar164._14_2_;
  auVar167._2_2_ = local_1808;
  auVar167._0_2_ = local_17f8;
  auVar167._4_2_ = uStack_17f6;
  auVar167._6_2_ = uStack_1806;
  auVar167._10_2_ = uStack_1804;
  auVar167._8_2_ = uStack_17f4;
  auVar167._12_2_ = uStack_17f2;
  auVar167._14_2_ = uStack_1802;
  auVar166._8_8_ = CONCAT44(iVar158,iVar158);
  auVar166._0_8_ = CONCAT44(iVar158,iVar158);
  auVar166 = pmaddwd(auVar167,auVar166);
  auVar165._2_2_ = uStack_16c0;
  auVar165._0_2_ = uStack_16b0;
  auVar165._4_2_ = uStack_16ae;
  auVar165._6_2_ = uStack_16be;
  auVar165._10_2_ = uStack_16bc;
  auVar165._8_2_ = uStack_16ac;
  auVar165._12_2_ = uStack_16aa;
  auVar165._14_2_ = uStack_16ba;
  auVar164._8_8_ = CONCAT44(iVar158,iVar158);
  auVar164._0_8_ = CONCAT44(iVar158,iVar158);
  auVar164 = pmaddwd(auVar165,auVar164);
  auVar163._2_2_ = local_1808;
  auVar163._0_2_ = local_17f8;
  auVar163._4_2_ = uStack_17f6;
  auVar163._6_2_ = uStack_1806;
  auVar163._10_2_ = uStack_1804;
  auVar163._8_2_ = uStack_17f4;
  auVar163._12_2_ = uStack_17f2;
  auVar163._14_2_ = uStack_1802;
  auVar162._8_8_ = uVar140;
  auVar162._0_8_ = uVar139;
  auVar162 = pmaddwd(auVar163,auVar162);
  auVar161._2_2_ = uStack_16c0;
  auVar161._0_2_ = uStack_16b0;
  auVar161._4_2_ = uStack_16ae;
  auVar161._6_2_ = uStack_16be;
  auVar161._10_2_ = uStack_16bc;
  auVar161._8_2_ = uStack_16ac;
  auVar161._12_2_ = uStack_16aa;
  auVar161._14_2_ = uStack_16ba;
  auVar160._8_8_ = uVar140;
  auVar160._0_8_ = uVar139;
  auVar160 = pmaddwd(auVar161,auVar160);
  local_1018 = auVar166._0_4_;
  iStack_1014 = auVar166._4_4_;
  iStack_1010 = auVar166._8_4_;
  iStack_100c = auVar166._12_4_;
  iStack_1010 = iStack_1010 + 0x800;
  iStack_100c = iStack_100c + 0x800;
  local_1038 = auVar164._0_4_;
  iStack_1034 = auVar164._4_4_;
  iStack_1030 = auVar164._8_4_;
  iStack_102c = auVar164._12_4_;
  local_1058 = auVar162._0_4_;
  iStack_1054 = auVar162._4_4_;
  iStack_1050 = auVar162._8_4_;
  iStack_104c = auVar162._12_4_;
  local_1078 = auVar160._0_4_;
  iStack_1074 = auVar160._4_4_;
  iStack_1070 = auVar160._8_4_;
  iStack_106c = auVar160._12_4_;
  auVar161 = ZEXT416(0xc);
  auVar162 = ZEXT416(0xc);
  auVar163 = ZEXT416(0xc);
  auVar164 = ZEXT416(0xc);
  auVar102._4_4_ = iStack_1014 + 0x800 >> auVar161;
  auVar102._0_4_ = local_1018 + 0x800 >> auVar161;
  auVar102._12_4_ = iStack_100c >> auVar161;
  auVar102._8_4_ = iStack_1010 >> auVar161;
  auVar101._4_4_ = iStack_1034 + 0x800 >> auVar162;
  auVar101._0_4_ = local_1038 + 0x800 >> auVar162;
  auVar101._12_4_ = iStack_102c + 0x800 >> auVar162;
  auVar101._8_4_ = iStack_1030 + 0x800 >> auVar162;
  packssdw(auVar102,auVar101);
  auVar100._4_4_ = iStack_1054 + 0x800 >> auVar163;
  auVar100._0_4_ = local_1058 + 0x800 >> auVar163;
  auVar100._12_4_ = iStack_104c + 0x800 >> auVar163;
  auVar100._8_4_ = iStack_1050 + 0x800 >> auVar163;
  auVar99._4_4_ = iStack_1074 + 0x800 >> auVar164;
  auVar99._0_4_ = local_1078 + 0x800 >> auVar164;
  auVar99._12_4_ = iStack_106c + 0x800 >> auVar164;
  auVar99._8_4_ = iStack_1070 + 0x800 >> auVar164;
  packssdw(auVar100,auVar99);
  __rounding_00[0]._4_4_ = iStack_fac + 0x800;
  __rounding_00[0]._0_4_ = iStack_fb0 + 0x800;
  __rounding_00[1]._0_4_ = local_f98 + 0x800;
  __rounding_00[1]._4_4_ = iStack_f94 + 0x800;
  idct16_stage5_sse2(auVar168._8_8_,auVar168._0_8_,__rounding_00,
                     (int8_t)((uint)(iStack_fb4 + 0x800) >> 0x18));
  __rounding_01[1] = local_1a78;
  __rounding_01[0] = lStack_1a60;
  idct16_stage6_sse2((__m128i *)CONCAT44(iVar147,iVar145),(int32_t *)CONCAT44(iVar143,iVar141),
                     __rounding_01,iStack_1a61);
  idct16_stage7_sse2(auVar160._0_8_,(__m128i *)CONCAT44(iStack_100c,iStack_1010));
  return;
}

Assistant:

static void idct16_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[1] = input[8];
  x[2] = input[4];
  x[3] = input[12];
  x[4] = input[2];
  x[5] = input[10];
  x[6] = input[6];
  x[7] = input[14];
  x[8] = input[1];
  x[9] = input[9];
  x[10] = input[5];
  x[11] = input[13];
  x[12] = input[3];
  x[13] = input[11];
  x[14] = input[7];
  x[15] = input[15];

  // stage 2
  btf_16_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);

  // stage 3
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  // stage 5~7
  idct16_stage5_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage6_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage7_sse2(output, x);
}